

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O0

void __thiscall LocaleTest_Format_Test::TestBody(LocaleTest_Format_Test *this)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  locale *loc_00;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  expected_expression;
  type this_00;
  AssertionResult gtest_ar_3;
  string s;
  AssertionResult gtest_ar_2;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  as;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  locale loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  char (*in_stack_fffffffffffffe08) [10];
  char *in_stack_fffffffffffffe10;
  string *this_01;
  char *in_stack_fffffffffffffe18;
  int iVar4;
  numpunct<char> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  Type in_stack_fffffffffffffe2c;
  Type type;
  locale *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  locale *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  locale *this_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe78;
  AssertHelper *in_stack_fffffffffffffe80;
  string local_168 [48];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  string local_110 [32];
  AssertionResult local_f0;
  undefined4 local_dc;
  undefined4 local_ac;
  string local_a8 [32];
  AssertionResult local_88 [2];
  undefined4 local_64;
  locale local_60;
  string local_58 [32];
  AssertionResult local_38 [2];
  locale local_18;
  locale local_10 [2];
  
  std::locale::locale(&local_18);
  loc_00 = (locale *)operator_new(0x18);
  loc_00->_M_impl = (_Impl *)0x0;
  loc_00[1]._M_impl = (_Impl *)0x0;
  loc_00[2]._M_impl = (_Impl *)0x0;
  numpunct<char>::numpunct
            ((numpunct<char> *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  std::locale::locale<numpunct<char>>
            (in_stack_fffffffffffffe30,
             (locale *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20);
  std::locale::~locale(&local_18);
  this_02 = &local_60;
  std::locale::locale(this_02);
  local_64 = 0x12d687;
  fmt::v5::format<char[5],int>
            (loc_00,(char (*) [5])this_02,
             (int *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  std::__cxx11::string::~string(local_58);
  std::locale::~locale(&local_60);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe40 =
         (locale *)testing::AssertionResult::failure_message((AssertionResult *)0x10aadf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
               (char *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
               in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    testing::Message::~Message((Message *)0x10ab3c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ab94);
  local_ac = 0x12d687;
  fmt::v5::format<char[5],int>
            (loc_00,(char (*) [5])this_02,(int *)CONCAT17(uVar1,in_stack_fffffffffffffe48));
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  std::__cxx11::string::~string(local_a8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_88);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe30 =
         (locale *)testing::AssertionResult::failure_message((AssertionResult *)0x10aca6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
               (char *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
               in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    testing::Message::~Message((Message *)0x10ad03);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ad5b);
  local_dc = 0x12d687;
  fmt::v5::
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
                      *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                     (int *)in_stack_fffffffffffffdf8);
  fmt::v5::format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>&>
            ((format_args *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
              *)in_stack_fffffffffffffdf8);
  local_128 = local_138;
  uStack_120 = uStack_130;
  args.field_1._0_7_ = in_stack_fffffffffffffe48;
  args.types_ = (unsigned_long_long)in_stack_fffffffffffffe40;
  args.field_1._7_1_ = uVar1;
  fmt::v5::vformat<char[5],char>
            ((locale *)CONCAT17(uVar2,in_stack_fffffffffffffe38),
             (char (*) [5])in_stack_fffffffffffffe30,args);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  iVar4 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  std::__cxx11::string::~string(local_110);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  type = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe2c);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe20 =
         (numpunct<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x10ae9a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,type,(char *)in_stack_fffffffffffffe20,
               iVar4,in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe80,(Message *)in_stack_fffffffffffffe78.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    testing::Message::~Message((Message *)0x10aef7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10af4f);
  this_01 = local_168;
  std::__cxx11::string::string(this_01);
  expected_expression = std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffdf8);
  out.container._7_1_ = uVar1;
  out.container._0_7_ = in_stack_fffffffffffffe48;
  this_00 = fmt::v5::format_to<std::back_insert_iterator<std::__cxx11::string>,char[5],int>
                      (out,in_stack_fffffffffffffe40,
                       (char (*) [5])CONCAT17(uVar2,in_stack_fffffffffffffe38),
                       (int *)in_stack_fffffffffffffe30);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)expected_expression.container,(char *)this_01,(char (*) [10])this_00.container,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  iVar4 = (int)((ulong)expected_expression.container >> 0x20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe70);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    testing::AssertionResult::failure_message((AssertionResult *)0x10b064);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,type,(char *)in_stack_fffffffffffffe20,
               iVar4,(char *)this_01);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.container,(Message *)in_stack_fffffffffffffe78.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffe00));
    testing::Message::~Message((Message *)0x10b0b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10b0fc);
  std::__cxx11::string::~string(local_168);
  std::locale::~locale(local_10);
  return;
}

Assistant:

TEST(LocaleTest, Format) {
  std::locale loc(std::locale(), new numpunct<char>());
  EXPECT_EQ("1,234,567", fmt::format(std::locale(), "{:n}", 1234567));
  EXPECT_EQ("1~234~567", fmt::format(loc, "{:n}", 1234567));
  fmt::format_arg_store<fmt::format_context, int> as{1234567};
  EXPECT_EQ("1~234~567", fmt::vformat(loc, "{:n}", fmt::format_args(as)));
  std::string s;
  fmt::format_to(std::back_inserter(s), loc, "{:n}", 1234567);
  EXPECT_EQ("1~234~567", s);
}